

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void __thiscall jpgd::jpeg_decoder::check_huff_tables(jpeg_decoder *this)

{
  void *pvVar1;
  long in_RDI;
  int i_1;
  int i;
  bool in_stack_00000027;
  size_t in_stack_00000028;
  jpeg_decoder *in_stack_00000030;
  huff_tables *in_stack_00000550;
  int in_stack_0000055c;
  jpeg_decoder *in_stack_00000560;
  jpgd_status status;
  undefined4 in_stack_fffffffffffffff0;
  int iVar2;
  
  iVar2 = 0;
  while( true ) {
    if (*(int *)(in_RDI + 0x200) <= iVar2) {
      for (iVar2 = 0; iVar2 < 8; iVar2 = iVar2 + 1) {
        if (*(long *)(in_RDI + 0xf8 + (long)iVar2 * 8) != 0) {
          if (*(long *)(in_RDI + 0x2a0 + (long)iVar2 * 8) == 0) {
            pvVar1 = alloc(in_stack_00000030,in_stack_00000028,in_stack_00000027);
            *(void **)(in_RDI + 0x2a0 + (long)iVar2 * 8) = pvVar1;
          }
          make_huff_table(in_stack_00000560,in_stack_0000055c,in_stack_00000550);
        }
      }
      return;
    }
    status = (jpgd_status)((ulong)in_RDI >> 0x20);
    if ((*(int *)(in_RDI + 0x234) == 0) &&
       (*(long *)(in_RDI + 0xf8 +
                 (long)*(int *)(in_RDI + 0x214 +
                               (long)*(int *)(in_RDI + 0x204 + (long)iVar2 * 4) * 4) * 8) == 0))
    break;
    if ((0 < *(int *)(in_RDI + 0x238)) &&
       (*(long *)(in_RDI + 0xf8 +
                 (long)*(int *)(in_RDI + 0x224 +
                               (long)*(int *)(in_RDI + 0x204 + (long)iVar2 * 4) * 4) * 8) == 0)) {
      stop_decoding((jpeg_decoder *)CONCAT44(iVar2,in_stack_fffffffffffffff0),status);
    }
    iVar2 = iVar2 + 1;
  }
  stop_decoding((jpeg_decoder *)CONCAT44(iVar2,in_stack_fffffffffffffff0),status);
}

Assistant:

void jpeg_decoder::check_huff_tables()
	{
		for (int i = 0; i < m_comps_in_scan; i++)
		{
			if ((m_spectral_start == 0) && (m_huff_num[m_comp_dc_tab[m_comp_list[i]]] == nullptr))
				stop_decoding(JPGD_UNDEFINED_HUFF_TABLE);

			if ((m_spectral_end > 0) && (m_huff_num[m_comp_ac_tab[m_comp_list[i]]] == nullptr))
				stop_decoding(JPGD_UNDEFINED_HUFF_TABLE);
		}

		for (int i = 0; i < JPGD_MAX_HUFF_TABLES; i++)
			if (m_huff_num[i])
			{
				if (!m_pHuff_tabs[i])
					m_pHuff_tabs[i] = (huff_tables*)alloc(sizeof(huff_tables));

				make_huff_table(i, m_pHuff_tabs[i]);
			}
	}